

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_TwoLevelShm_Async.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP5Writer::WriteData_TwoLevelShm_Async(BP5Writer *this,BufferV *Data)

{
  Comm *this_00;
  Comm *this_01;
  AsyncWriteInfo **ppAVar1;
  double dVar2;
  double dVar3;
  unsigned_long uVar4;
  pointer pCVar5;
  int iVar6;
  int iVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  AsyncWriteInfo *pAVar10;
  TokenChain<unsigned_long> *this_02;
  uint64_t uVar11;
  unsigned_long *puVar12;
  ulong uVar13;
  ulong blocksize;
  Comm *this_03;
  allocator local_a9;
  uint64_t *local_a8;
  uint64_t nextWriterPos_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98 [3];
  MPIShmChain *local_80;
  BufferV *local_78;
  Comm local_70;
  Comm local_68;
  uint64_t nextWriterPos;
  vector<unsigned_long,_std::allocator<unsigned_long>_> mySizes;
  
  if (this->m_Aggregator == (MPIAggregator *)0x0) {
    local_80 = (MPIShmChain *)0x0;
  }
  else {
    local_80 = (MPIShmChain *)
               __dynamic_cast(this->m_Aggregator,&aggregator::MPIAggregator::typeinfo,
                              &aggregator::MPIShmChain::typeinfo);
  }
  local_a8 = &this->m_DataPos;
  uVar8 = helper::PaddingToAlignOffset
                    (this->m_DataPos,(ulong)(this->super_BP5Engine).m_Parameters.StripeSize);
  this->m_DataPos = this->m_DataPos + uVar8;
  this_00 = &(local_80->super_MPIAggregator).m_Comm;
  local_78 = Data;
  uVar8 = adios2::format::BufferV::Size(Data);
  blocksize = 0;
  helper::Comm::GatherValues<unsigned_long>(&mySizes,this_00,uVar8,0);
  uVar8 = 0;
  for (; mySizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start !=
         mySizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
      mySizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           mySizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    uVar13 = *mySizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar8 = uVar8 + uVar13;
    if (blocksize < uVar13) {
      blocksize = uVar13;
    }
  }
  iVar6 = helper::Comm::Size(this_00);
  if (1 < iVar6) {
    uVar13 = (ulong)(this->super_BP5Engine).m_Parameters.DirectIOAlignOffset;
    if ((this->super_BP5Engine).m_Parameters.DirectIO == false) {
      uVar13 = 0x20;
    }
    aggregator::MPIShmChain::CreateShm
              (local_80,blocksize,(this->super_BP5Engine).m_Parameters.MaxShmSize,uVar13);
  }
  if ((local_80->super_MPIAggregator).m_IsAggregator != true) goto LAB_004cf401;
  this_01 = &local_80->m_AggregatorChainComm;
  iVar6 = helper::Comm::Rank(this_01);
  if (iVar6 < 1) {
    uVar9 = *local_a8;
  }
  else {
    iVar6 = helper::Comm::Rank(this_01);
    std::__cxx11::string::string
              ((string *)&nextWriterPos_2,
               "AggregatorChain token in BP5Writer::WriteData_TwoLevelShm",&local_a9);
    helper::Comm::Recv<unsigned_long>
              ((Status *)&nextWriterPos,this_01,local_a8,1,iVar6 + -1,0,(string *)&nextWriterPos_2);
    std::__cxx11::string::~string((string *)&nextWriterPos_2);
    uVar9 = helper::PaddingToAlignOffset
                      (this->m_DataPos,(ulong)(this->super_BP5Engine).m_Parameters.StripeSize);
    uVar9 = uVar9 + *local_a8;
    *local_a8 = uVar9;
  }
  this->m_StartDataPos = uVar9;
  iVar6 = helper::Comm::Rank(this_01);
  iVar7 = helper::Comm::Size(this_01);
  if (iVar6 < iVar7 + -1) {
    nextWriterPos = *local_a8 + uVar8;
    iVar6 = helper::Comm::Rank(this_01);
    std::__cxx11::string::string
              ((string *)&nextWriterPos_2,"Chain token in BP5Writer::WriteData",&local_a9);
    helper::Comm::Isend<unsigned_long>
              (&local_68,(unsigned_long *)this_01,(size_t)&nextWriterPos,1,iVar6 + 1,(string *)0x0);
    this_03 = &local_68;
LAB_004cf376:
    helper::Comm::Req::~Req((Req *)this_03);
    std::__cxx11::string::~string((string *)&nextWriterPos_2);
  }
  else {
    iVar6 = helper::Comm::Size(this_01);
    if (1 < iVar6) {
      nextWriterPos = *local_a8 + uVar8;
      std::__cxx11::string::string
                ((string *)&nextWriterPos_2,"Chain token in BP5Writer::WriteData",&local_a9);
      helper::Comm::Isend<unsigned_long>
                (&local_70,(unsigned_long *)this_01,(size_t)&nextWriterPos,1,0,(string *)0x0);
      this_03 = &local_70;
      goto LAB_004cf376;
    }
  }
  iVar6 = helper::Comm::Rank(this_01);
  if (iVar6 == 0) {
    iVar6 = helper::Comm::Size(this_01);
    if (iVar6 < 2) {
      this->m_DataPos = this->m_StartDataPos + uVar8;
    }
    else {
      iVar6 = helper::Comm::Size(this_01);
      std::__cxx11::string::string
                ((string *)&nextWriterPos_2,"Chain token in BP5Writer::WriteData",&local_a9);
      helper::Comm::Recv<unsigned_long>
                ((Status *)&nextWriterPos,this_01,local_a8,1,iVar6 + -1,0,(string *)&nextWriterPos_2
                );
      std::__cxx11::string::~string((string *)&nextWriterPos_2);
    }
  }
LAB_004cf401:
  pAVar10 = (AsyncWriteInfo *)operator_new(0xa0);
  memset(pAVar10,0,0xa0);
  AsyncWriteInfo::AsyncWriteInfo(pAVar10);
  this->m_AsyncWriteInfo = pAVar10;
  pAVar10->aggregator = this->m_Aggregator;
  iVar6 = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  ppAVar1 = &this->m_AsyncWriteInfo;
  (*ppAVar1)->rank_global = iVar6;
  iVar6 = helper::Comm::Rank(this_00);
  (*ppAVar1)->rank_chain = iVar6;
  iVar6 = helper::Comm::Size(this_00);
  (*ppAVar1)->nproc_chain = iVar6;
  helper::Comm::Comm((Comm *)&nextWriterPos_2);
  helper::Comm::operator=(&(*ppAVar1)->comm_chain,(Comm *)&nextWriterPos_2);
  helper::Comm::~Comm((Comm *)&nextWriterPos_2);
  (this->m_AsyncWriteInfo->tstart).__d.__r = (this->m_EngineStart).__d.__r;
  this_02 = (TokenChain<unsigned_long> *)operator_new(0x20);
  shm::TokenChain<unsigned_long>::TokenChain(this_02,this_00);
  pAVar10 = this->m_AsyncWriteInfo;
  pAVar10->tokenChain = this_02;
  pAVar10->tm = &this->m_FileDataManager;
  pAVar10->Data = local_78;
  pAVar10->flagRush = &this->m_flagRush;
  pAVar10->lock = &this->m_AsyncWriteLock;
  if ((local_80->super_MPIAggregator).m_IsAggregator == true) {
    uVar9 = this->m_StartDataPos;
    uVar11 = adios2::format::BufferV::Size(local_78);
    nextWriterPos_2 = uVar11 + uVar9;
    shm::TokenChain<unsigned_long>::SendToken(this->m_AsyncWriteInfo->tokenChain,&nextWriterPos_2);
    shm::TokenChain<unsigned_long>::RecvToken((*ppAVar1)->tokenChain);
  }
  else {
    puVar12 = shm::TokenChain<unsigned_long>::RecvToken(this_02);
    uVar4 = *puVar12;
    this->m_StartDataPos = uVar4;
    uVar9 = adios2::format::BufferV::Size(local_78);
    nextWriterPos_2 = uVar9 + uVar4;
    shm::TokenChain<unsigned_long>::SendToken(this->m_AsyncWriteInfo->tokenChain,&nextWriterPos_2);
  }
  pAVar10 = this->m_AsyncWriteInfo;
  pAVar10->startPos = this->m_StartDataPos;
  pAVar10->totalSize = uVar8;
  dVar2 = (this->m_ExpectedTimeBetweenSteps).__r;
  pAVar10->deadline = dVar2;
  dVar3 = this->m_ComputationBlocksLength;
  iVar6 = (this->super_BP5Engine).m_Parameters.AsyncWrite;
  if (iVar6 != 2 || dVar3 <= 0.0) {
    if (iVar6 == 1) {
      pAVar10->deadline = 0.0;
    }
    pAVar10->inComputationBlock = (bool *)0x0;
    pAVar10->computationBlocksLength = 0.0;
    pAVar10->currentComputationBlocks =
         (vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
          *)0x0;
    pAVar10->currentComputationBlockID = (size_t *)0x0;
  }
  else {
    pAVar10->inComputationBlock = &this->m_InComputationBlock;
    pAVar10->computationBlocksLength = dVar3;
    if (dVar2 < dVar3) {
      pAVar10->deadline = dVar3;
    }
    std::
    vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
    ::operator=(&pAVar10->expectedComputationBlocks,&this->m_ComputationBlockTimes);
    pAVar10 = this->m_AsyncWriteInfo;
    pAVar10->currentComputationBlocks = &this->m_ComputationBlockTimes;
    pAVar10->currentComputationBlockID = &this->m_ComputationBlockID;
    pCVar5 = (this->m_ComputationBlockTimes).
             super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_ComputationBlockTimes).
        super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish != pCVar5) {
      (this->m_ComputationBlockTimes).
      super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = pCVar5;
    }
    this->m_ComputationBlocksLength = 0.0;
    this->m_ComputationBlockID = 0;
  }
  std::
  async<int(&)(adios2::core::engine::BP5Writer::AsyncWriteInfo*),adios2::core::engine::BP5Writer::AsyncWriteInfo*&>
            ((launch)&nextWriterPos_2,(_func_int_AsyncWriteInfo_ptr *)0x1,
             (AsyncWriteInfo **)AsyncWriteThread_TwoLevelShm);
  std::future<int>::operator=(&this->m_WriteFuture,(future<int> *)&nextWriterPos_2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_98);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&mySizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void BP5Writer::WriteData_TwoLevelShm_Async(format::BufferV *Data)
{
    aggregator::MPIShmChain *a = dynamic_cast<aggregator::MPIShmChain *>(m_Aggregator);

    // new step writing starts at offset m_DataPos on master aggregator
    // other aggregators to the same file will need to wait for the position
    // to arrive from the rank below

    // align to PAGE_SIZE (only valid on master aggregator at this point)
    m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);

    // Each aggregator needs to know the total size they write
    // This calculation is valid on aggregators only
    std::vector<uint64_t> mySizes = a->m_Comm.GatherValues(Data->Size());
    uint64_t myTotalSize = 0;
    uint64_t maxSize = 0;
    for (auto s : mySizes)
    {
        myTotalSize += s;
        if (s > maxSize)
        {
            maxSize = s;
        }
    }

    if (a->m_Comm.Size() > 1)
    {
        size_t alignment_size = sizeof(max_align_t);
        if (m_Parameters.DirectIO)
        {
            alignment_size = m_Parameters.DirectIOAlignOffset;
        }
        a->CreateShm(static_cast<size_t>(maxSize), m_Parameters.MaxShmSize, alignment_size);
    }

    if (a->m_IsAggregator)
    {
        // In each aggregator chain, send from master down the line
        // these total sizes, so every aggregator knows where to start
        if (a->m_AggregatorChainComm.Rank() > 0)
        {
            a->m_AggregatorChainComm.Recv(
                &m_DataPos, 1, a->m_AggregatorChainComm.Rank() - 1, 0,
                "AggregatorChain token in BP5Writer::WriteData_TwoLevelShm");
            // align to PAGE_SIZE
            m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);
        }
        m_StartDataPos = m_DataPos; // metadata needs this info
        if (a->m_AggregatorChainComm.Rank() < a->m_AggregatorChainComm.Size() - 1)
        {
            uint64_t nextWriterPos = m_DataPos + myTotalSize;
            a->m_AggregatorChainComm.Isend(&nextWriterPos, 1, a->m_AggregatorChainComm.Rank() + 1,
                                           0, "Chain token in BP5Writer::WriteData");
        }
        else if (a->m_AggregatorChainComm.Size() > 1)
        {
            // send back final position from last aggregator in file to master
            // aggregator
            uint64_t nextWriterPos = m_DataPos + myTotalSize;
            a->m_AggregatorChainComm.Isend(&nextWriterPos, 1, 0, 0,
                                           "Chain token in BP5Writer::WriteData");
        }

        // Master aggregator needs to know where the last writing ended by the
        // last aggregator in the chain, so that it can start from the correct
        // position at the next output step
        if (!a->m_AggregatorChainComm.Rank())
        {
            if (a->m_AggregatorChainComm.Size() > 1)
            {
                a->m_AggregatorChainComm.Recv(&m_DataPos, 1, a->m_AggregatorChainComm.Size() - 1, 0,
                                              "Chain token in BP5Writer::WriteData");
            }
            else
            {
                m_DataPos = m_StartDataPos + myTotalSize;
            }
        }
    }

    /*std::cout << "Rank " << m_Comm.Rank() << "  start data async "
              << " to subfile " << a->m_SubStreamIndex << " at pos "
              << m_StartDataPos << std::endl;*/

    m_AsyncWriteInfo = new AsyncWriteInfo();
    m_AsyncWriteInfo->aggregator = m_Aggregator;
    m_AsyncWriteInfo->rank_global = m_Comm.Rank();
    m_AsyncWriteInfo->rank_chain = a->m_Comm.Rank();
    m_AsyncWriteInfo->nproc_chain = a->m_Comm.Size();
    m_AsyncWriteInfo->comm_chain = helper::Comm(); // unused in this aggregation
    m_AsyncWriteInfo->tstart = m_EngineStart;
    m_AsyncWriteInfo->tokenChain = new shm::TokenChain<uint64_t>(&a->m_Comm);
    m_AsyncWriteInfo->tm = &m_FileDataManager;
    m_AsyncWriteInfo->Data = Data;
    m_AsyncWriteInfo->flagRush = &m_flagRush;
    m_AsyncWriteInfo->lock = &m_AsyncWriteLock;

    // Metadata collection needs m_StartDataPos correctly set on
    // every process before we call the async writing thread
    if (a->m_IsAggregator)
    {
        // Informs next process its starting offset (for correct metadata)
        uint64_t nextWriterPos = m_StartDataPos + Data->Size();
        m_AsyncWriteInfo->tokenChain->SendToken(nextWriterPos);
        m_AsyncWriteInfo->tokenChain->RecvToken();
    }
    else
    {
        // non-aggregators fill shared buffer in marching order
        // they also receive their starting offset this way
        m_StartDataPos = m_AsyncWriteInfo->tokenChain->RecvToken();
        uint64_t nextWriterPos = m_StartDataPos + Data->Size();
        m_AsyncWriteInfo->tokenChain->SendToken(nextWriterPos);
    }

    // Launch data writing thread, m_StartDataPos is valid
    // m_DataPos is already pointing to the end of the write, do not use here.
    m_AsyncWriteInfo->startPos = m_StartDataPos;
    m_AsyncWriteInfo->totalSize = myTotalSize;
    m_AsyncWriteInfo->deadline = m_ExpectedTimeBetweenSteps.count();

    if (m_ComputationBlocksLength > 0.0 && m_Parameters.AsyncWrite == (int)AsyncWrite::Guided)
    {
        m_AsyncWriteInfo->inComputationBlock = &m_InComputationBlock;
        m_AsyncWriteInfo->computationBlocksLength = m_ComputationBlocksLength;
        if (m_AsyncWriteInfo->deadline < m_ComputationBlocksLength)
        {
            m_AsyncWriteInfo->deadline = m_ComputationBlocksLength;
        }
        m_AsyncWriteInfo->expectedComputationBlocks = m_ComputationBlockTimes; // copy!
        m_AsyncWriteInfo->currentComputationBlocks = &m_ComputationBlockTimes; // ptr!
        m_AsyncWriteInfo->currentComputationBlockID = &m_ComputationBlockID;

        /* Clear current block tracker now so that async thread does not get
        confused with the past info */
        m_ComputationBlockTimes.clear();
        m_ComputationBlocksLength = 0.0;
        m_ComputationBlockID = 0;
    }
    else
    {
        if (m_Parameters.AsyncWrite == (int)AsyncWrite::Naive)
        {
            m_AsyncWriteInfo->deadline = 0;
        }
        m_AsyncWriteInfo->inComputationBlock = nullptr;
        m_AsyncWriteInfo->computationBlocksLength = 0.0;
        m_AsyncWriteInfo->currentComputationBlocks = nullptr;
        m_AsyncWriteInfo->currentComputationBlockID = nullptr;
    }

    m_WriteFuture = std::async(std::launch::async, AsyncWriteThread_TwoLevelShm, m_AsyncWriteInfo);

    /* At this point it is prohibited in the main thread
       - to modify Data, which will be deleted in the async thread any tiume
       - to use m_FileDataManager until next BeginStep, which is being used
         in the async thread to write data
    */
}